

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Request * __thiscall
kj::anon_unknown_36::NetworkAddressHttpClient::request
          (Request *__return_storage_ptr__,NetworkAddressHttpClient *this,HttpMethod method,
          StringPtr url,HttpHeaders *headers,Maybe<unsigned_long> *expectedBodySize)

{
  StringPtr url_00;
  RefcountedClient *pRVar1;
  HttpClientImpl *this_00;
  RefOrVoid<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient> object;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t> *other;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
  local_c0;
  Promise<kj::HttpClient::Response> local_b0;
  undefined1 local_a8 [16];
  Own<kj::AsyncOutputStream,_std::nullptr_t> local_98;
  Maybe<unsigned_long> local_88;
  Event *local_78;
  Event **ppEStack_70;
  undefined1 local_49;
  undefined1 local_48 [8];
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
  refcounted;
  HttpHeaders *headers_local;
  HttpMethod method_local;
  NetworkAddressHttpClient *this_local;
  StringPtr url_local;
  Request *result;
  
  refcounted.ptr = (RefcountedClient *)headers;
  getClient((NetworkAddressHttpClient *)local_48);
  local_49 = 0;
  pRVar1 = Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
           ::operator->((Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
                         *)local_48);
  this_00 = Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t>::operator->
                      (&pRVar1->client);
  pRVar1 = refcounted.ptr;
  local_78 = (Event *)url.content.ptr;
  ppEStack_70 = (Event **)url.content.size_;
  Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)(local_a8 + 0x20),expectedBodySize);
  url_00.content.size_ = (size_t)ppEStack_70;
  url_00.content.ptr = (char *)local_78;
  HttpClientImpl::request
            (__return_storage_ptr__,this_00,method,url_00,(HttpHeaders *)pRVar1,
             (Maybe<unsigned_long> *)(local_a8 + 0x20));
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)(local_a8 + 0x20));
  object = Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
           ::operator*((Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
                        *)local_48);
  addRef<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient>
            ((kj *)local_a8,object);
  Own<kj::AsyncOutputStream,decltype(nullptr)>::
  attach<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,decltype(nullptr)>>
            ((Own<kj::AsyncOutputStream,decltype(nullptr)> *)(local_a8 + 0x10),
             (Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
              *)__return_storage_ptr__);
  Own<kj::AsyncOutputStream,_std::nullptr_t>::operator=
            (&__return_storage_ptr__->body,
             (Own<kj::AsyncOutputStream,_std::nullptr_t> *)(local_a8 + 0x10));
  Own<kj::AsyncOutputStream,_std::nullptr_t>::~Own
            ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)(local_a8 + 0x10));
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
              *)local_a8);
  other = mv<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,decltype(nullptr)>>
                    ((Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
                      *)local_48);
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>::Own
            (&local_c0,other);
  Promise<kj::HttpClient::Response>::
  then<kj::(anonymous_namespace)::NetworkAddressHttpClient::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda(kj::HttpClient::Response&&)_1_>
            (&local_b0,(Type *)&__return_storage_ptr__->response);
  Promise<kj::HttpClient::Response>::operator=(&__return_storage_ptr__->response,&local_b0);
  Promise<kj::HttpClient::Response>::~Promise(&local_b0);
  kj::(anonymous_namespace)::NetworkAddressHttpClient::
  request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::
  {lambda(kj::HttpClient::Response&&)#1}::~Response
            ((_lambda_kj__HttpClient__Response____1_ *)&local_c0);
  local_49 = 1;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
              *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Request request(HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
                  kj::Maybe<uint64_t> expectedBodySize = kj::none) override {
    auto refcounted = getClient();
    auto result = refcounted->client->request(method, url, headers, expectedBodySize);
    result.body = result.body.attach(kj::addRef(*refcounted));
    result.response = result.response.then(
        [refcounted=kj::mv(refcounted)](Response&& response) mutable {
      response.body = response.body.attach(kj::mv(refcounted));
      return kj::mv(response);
    });
    return result;
  }